

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

string * __thiscall
nlohmann::detail::
iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::iteration_proxy_internal::key(string *__return_storage_ptr__,iteration_proxy_internal *this)

{
  value_t vVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  char cVar5;
  
  vVar1 = ((this->anchor).m_object)->m_type;
  if (vVar1 == object) {
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::key(__return_storage_ptr__,&this->anchor);
  }
  else if (vVar1 == array) {
    __val = this->array_index;
    cVar5 = '\x01';
    if (9 < __val) {
      uVar4 = __val;
      cVar3 = '\x04';
      do {
        cVar5 = cVar3;
        if (uVar4 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0012bda2;
        }
        if (uVar4 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0012bda2;
        }
        if (uVar4 < 10000) goto LAB_0012bda2;
        bVar2 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar3 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_0012bda2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,__val);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string key() const
{
assert(anchor.m_object != nullptr);

switch (anchor.m_object->type())
{
// use integer array index as key
case value_t::array:
return std::to_string(array_index);

// use key from the object
case value_t::object:
return anchor.key();

// use an empty key for all primitive types
default:
return "";
}
}